

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

Vector<int,_std::allocator<int>_> * __thiscall
amrex::TagBox::tags(Vector<int,_std::allocator<int>_> *__return_storage_ptr__,TagBox *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer piVar3;
  uint in_EAX;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined8 uStack_18;
  
  uVar1 = *(undefined8 *)(this->super_BaseFab<char>).domain.bigend.vect;
  uVar2 = *(undefined8 *)(this->super_BaseFab<char>).domain.smallend.vect;
  uStack_18 = (ulong)in_EAX;
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
             (long)(((this->super_BaseFab<char>).domain.bigend.vect[2] -
                    (this->super_BaseFab<char>).domain.smallend.vect[2]) + 1) *
             (long)(((int)uVar1 - (int)uVar2) + 1) *
             (long)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1),
             (value_type_conflict *)((long)&uStack_18 + 4),(allocator_type *)((long)&uStack_18 + 3))
  ;
  pcVar4 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  piVar3 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)piVar3 >> 2;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      if (pcVar4[lVar6] != '\0') {
        piVar3[lVar6] = (int)pcVar4[lVar6];
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int>
TagBox::tags () const noexcept
{
    Vector<int> ar(domain.numPts(), TagBox::CLEAR);

    const TagType* cptr = dataPtr();
    int*           iptr = ar.dataPtr();

    for (int i = 0; i < ar.size(); i++, cptr++, iptr++)
    {
        if (*cptr)
            *iptr = *cptr;
    }

    return ar;
}